

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  uint uVar1;
  undefined4 uVar2;
  ImGuiTabItem *pIVar3;
  undefined4 uVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  float fVar7;
  float fVar8;
  ImS16 IVar9;
  ImS16 IVar10;
  ImGuiID IVar11;
  ImGuiTabItemFlags IVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  ImGuiID IVar16;
  ImGuiTabItemFlags IVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  ImGuiTabItem *tab;
  ImGuiTabItem item_tmp;
  undefined1 uStack_19;
  
  if (tab_bar->ReorderRequestTabId == 0) {
    return false;
  }
  lVar22 = (long)(tab_bar->Tabs).Size;
  if (0 < lVar22) {
    tab = (tab_bar->Tabs).Data;
    do {
      if (tab->ID == tab_bar->ReorderRequestTabId) {
        if ((tab->Flags & 0x20) != 0) {
          return false;
        }
        iVar20 = ImGuiTabBar::GetTabOrder(tab_bar,tab);
        uVar21 = tab_bar->ReorderRequestDir + iVar20;
        if ((int)uVar21 < 0) {
          return false;
        }
        if ((tab_bar->Tabs).Size <= (int)uVar21) {
          return false;
        }
        pIVar3 = (tab_bar->Tabs).Data;
        uVar1 = pIVar3[uVar21].Flags;
        if ((uVar1 & 0x20) != 0) {
          return false;
        }
        if (((uVar1 ^ tab->Flags) & 0xc0) != 0) {
          return false;
        }
        pIVar3 = pIVar3 + uVar21;
        uVar2._0_2_ = tab->IndexDuringLayout;
        uVar2._2_1_ = tab->WantClose;
        uVar2._3_1_ = tab->field_0x23;
        IVar16 = tab->ID;
        IVar17 = tab->Flags;
        iVar18 = tab->LastFrameVisible;
        iVar19 = tab->LastFrameSelected;
        fVar14 = tab->Offset;
        fVar15 = tab->Width;
        uVar4 = tab->ContentWidth;
        uVar5 = tab->NameOffset;
        uVar6 = tab->BeginOrder;
        uStack_19 = (undefined1)((ushort)uVar6 >> 8);
        *(undefined4 *)((long)&tab->BeginOrder + 1) = *(undefined4 *)((long)&pIVar3->BeginOrder + 1)
        ;
        IVar11 = pIVar3->ID;
        IVar12 = pIVar3->Flags;
        iVar20 = pIVar3->LastFrameVisible;
        iVar13 = pIVar3->LastFrameSelected;
        fVar7 = pIVar3->Width;
        fVar8 = pIVar3->ContentWidth;
        IVar9 = pIVar3->NameOffset;
        IVar10 = pIVar3->BeginOrder;
        tab->Offset = pIVar3->Offset;
        tab->Width = fVar7;
        tab->ContentWidth = fVar8;
        tab->NameOffset = IVar9;
        tab->BeginOrder = IVar10;
        tab->ID = IVar11;
        tab->Flags = IVar12;
        tab->LastFrameVisible = iVar20;
        tab->LastFrameSelected = iVar13;
        *(uint *)((long)&pIVar3->BeginOrder + 1) = CONCAT31((int3)uVar2,uStack_19);
        pIVar3->Offset = fVar14;
        pIVar3->Width = fVar15;
        pIVar3->ContentWidth = (float)uVar4;
        pIVar3->NameOffset = uVar5;
        pIVar3->BeginOrder = uVar6;
        pIVar3->ID = IVar16;
        pIVar3->Flags = IVar17;
        pIVar3->LastFrameVisible = iVar18;
        pIVar3->LastFrameSelected = iVar19;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
      tab = tab + 1;
      lVar22 = lVar22 + -1;
    } while (lVar22 != 0);
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}